

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  undefined8 uVar5;
  size_t sVar6;
  uint uVar7;
  IResultCapture *pIVar8;
  long *local_40 [2];
  long local_30 [2];
  
  sVar4 = (builder->m_info).macroName.m_size;
  (this->m_info).macroName.m_start = (builder->m_info).macroName.m_start;
  (this->m_info).macroName.m_size = sVar4;
  this_00 = &(this->m_info).message;
  paVar1 = &(this->m_info).message.field_2;
  (this->m_info).message._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (builder->m_info).message._M_dataplus._M_p;
  paVar2 = &(builder->m_info).message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(builder->m_info).message.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_info).message.field_2 + 8) = uVar5;
  }
  else {
    (this_00->_M_dataplus)._M_p = pcVar3;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_info).message._M_string_length = (builder->m_info).message._M_string_length;
  (builder->m_info).message._M_dataplus._M_p = (pointer)paVar2;
  (builder->m_info).message._M_string_length = 0;
  (builder->m_info).message.field_2._M_local_buf[0] = '\0';
  uVar7 = (builder->m_info).sequence;
  (this->m_info).type = (builder->m_info).type;
  (this->m_info).sequence = uVar7;
  sVar6 = (builder->m_info).lineInfo.line;
  (this->m_info).lineInfo.file = (builder->m_info).lineInfo.file;
  (this->m_info).lineInfo.line = sVar6;
  this->m_moved = false;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this_00,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pIVar8 = getResultCapture();
  (*pIVar8->_vptr_IResultCapture[0xc])(pIVar8,this);
  return;
}

Assistant:

ScopedMessage::ScopedMessage( MessageBuilder&& builder ):
        m_info( CATCH_MOVE(builder.m_info) ) {
        m_info.message = builder.m_stream.str();
        getResultCapture().pushScopedMessage( m_info );
    }